

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generator.cpp
# Opt level: O2

string * cpp_bindgen::wrap_line(string *__return_storage_ptr__,string *line,string *prefix)

{
  pointer pcVar1;
  runtime_error *this;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __last;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __first;
  string current_prefix;
  string line_divider;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&line_divider," &",(allocator<char> *)&current_prefix);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)__return_storage_ptr__,"",(allocator<char> *)&current_prefix);
  std::__cxx11::string::string((string *)&current_prefix,(string *)prefix);
  pcVar1 = (line->_M_dataplus)._M_p;
  __first._M_current = pcVar1;
  do {
    if (pcVar1 + line->_M_string_length <=
        __first._M_current + (0x84 - current_prefix._M_string_length)) {
      std::__cxx11::string::append((string *)__return_storage_ptr__);
      std::__cxx11::string::
      append<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,void>
                ((string *)__return_storage_ptr__,__first,
                 (__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  )((line->_M_dataplus)._M_p + line->_M_string_length));
      std::__cxx11::string::push_back((char)__return_storage_ptr__);
      std::__cxx11::string::~string((string *)&current_prefix);
      std::__cxx11::string::~string((string *)&line_divider);
      return __return_storage_ptr__;
    }
    __last._M_current =
         __first._M_current +
         ((0x84 - line_divider._M_string_length) - current_prefix._M_string_length);
    while (__last._M_current[-1] != ',') {
      __last._M_current = __last._M_current + -1;
      if (__last._M_current == pcVar1 + 1) {
        this = (runtime_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error(this,"Too long line cannot be wrapped");
        __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
    }
    std::__cxx11::string::append((string *)__return_storage_ptr__);
    std::__cxx11::string::
    append<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,void>
              ((string *)__return_storage_ptr__,__first,__last);
    std::operator+(&local_50,&line_divider,"\n");
    std::__cxx11::string::append((string *)__return_storage_ptr__);
    std::__cxx11::string::~string((string *)&local_50);
    std::operator+(&local_50,prefix,"   ");
    std::__cxx11::string::operator=((string *)&current_prefix,(string *)&local_50);
    std::__cxx11::string::~string((string *)&local_50);
    pcVar1 = (line->_M_dataplus)._M_p;
    __first._M_current = __last._M_current;
  } while( true );
}

Assistant:

std::string wrap_line(const std::string &line, const std::string &prefix) {
        static constexpr unsigned int max_line_length = 132;
        const std::string line_divider = " &";
        std::string ret = "";
        std::string current_prefix = prefix;

        auto it = line.begin();
        while (it + max_line_length - current_prefix.size() < line.end()) {
            auto next_it = it + max_line_length - line_divider.size() - current_prefix.size();
            while (*(next_it - 1) != ',') {
                --next_it;
                if (next_it == line.begin() + 1)
                    throw std::runtime_error("Too long line cannot be wrapped");
            }

            ret.append(current_prefix);
            ret.append(it, next_it);
            ret.append(line_divider + "\n");

            it = next_it;
            // more indentation on next line
            current_prefix = prefix + "   ";
        }
        ret += current_prefix;
        ret.append(it, line.end());
        ret += '\n';
        return ret;
    }